

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double * dirichlet_mix_sample
                   (int comp_num,int elem_num,double *a,double *comp_weight,int *seed,int *comp)

{
  int iVar1;
  int iVar2;
  double *a_00;
  double *pdVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = 0xffffffffffffffff;
  if (-1 < elem_num) {
    uVar5 = (ulong)(uint)elem_num << 3;
  }
  a_00 = (double *)operator_new__(uVar5);
  iVar1 = (*seed % 0x1f31d) * 0x41a7;
  iVar4 = (*seed / 0x1f31d) * -0xb14;
  iVar2 = iVar1 + iVar4;
  iVar1 = iVar1 + iVar4 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  *seed = iVar1;
  iVar1 = discrete_cdf_inv((double)iVar1 * 4.656612875e-10,comp_num,comp_weight);
  *comp = iVar1;
  if (0 < elem_num) {
    memcpy(a_00,a + (iVar1 + -1) * elem_num,(ulong)(uint)elem_num << 3);
  }
  pdVar3 = dirichlet_sample(elem_num,a_00,seed);
  operator_delete__(a_00);
  return pdVar3;
}

Assistant:

double *dirichlet_mix_sample ( int comp_num, int elem_num, double a[],
  double comp_weight[], int &seed, int *comp )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_MIX_SAMPLE samples a Dirichlet mixture PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int COMP_NUM, the number of components in the Dirichlet
//    mixture density, that is, the number of distinct Dirichlet PDF's
//    that are mixed together.
//
//    Input, int ELEM_NUM, the number of elements of an observation.
//
//    Input, double A[ELEM_NUM*COMP_NUM], the probabilities for
//    element ELEM_NUM in component COMP_NUM.
//    Each A[I,J] should be positive.
//
//    Input, double COMP_WEIGHT[COMP_NUM], the mixture weights of the densities.
//    These do not need to be normalized.  The weight of a given component is
//    the relative probability that that component will be used to generate
//    the sample.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, int *COMP, the index of the component of the Dirichlet
//    mixture that was chosen to generate the sample.
//
//    Output, double DIRICHLET_MIX_SAMPLE[ELEM_NUM], a sample of the PDF.
//
{
  double *a_vec;
  int elem_i;
  double *x;

  a_vec = new double[elem_num];
//
//  Choose a particular density component COMP.
//
  *comp = discrete_sample ( comp_num, comp_weight, seed );
//
//  Sample the density number COMP.
//
  for ( elem_i = 0; elem_i < elem_num; elem_i++ )
  {
    a_vec[elem_i] = a[elem_i+(*comp-1)*elem_num];
  }

  x = dirichlet_sample ( elem_num, a_vec, seed );

  delete [] a_vec;

  return x;
}